

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void x_cb(Fl_Value_Input *i,void *v)

{
  Fl_Window *this;
  bool bVar1;
  int minh;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int maxh;
  Fl_Window *pFVar7;
  double dVar8;
  Fl_Widget *w;
  Fl_Type *o;
  int mod;
  void *v_local;
  Fl_Value_Input *i_local;
  
  if ((char *)v == "LOAD") {
    x_input = i;
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if (iVar2 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)x_input);
    }
    else {
      iVar2 = Fl_Widget::x(current_widget->o);
      Fl_Valuator::value(&i->super_Fl_Valuator,(double)iVar2);
      Fl_Widget::activate((Fl_Widget *)x_input);
    }
  }
  else {
    bVar1 = false;
    for (w = (Fl_Widget *)Fl_Type::first; w != (Fl_Widget *)0x0;
        w = *(Fl_Widget **)&(w->label_).color) {
      if ((*(char *)((long)&(w->label_).deimage + 1) != '\0') &&
         (iVar2 = (*w->_vptr_Fl_Widget[0x17])(), iVar2 != 0)) {
        this = *(Fl_Window **)&w[1].label_.type;
        dVar8 = Fl_Valuator::value(&i->super_Fl_Valuator);
        uVar3 = Fl_Widget::y((Fl_Widget *)this);
        uVar4 = Fl_Widget::w((Fl_Widget *)this);
        uVar5 = Fl_Widget::h((Fl_Widget *)this);
        (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                  (this,(ulong)(uint)(int)dVar8,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
        pFVar7 = Fl_Widget::window((Fl_Widget *)this);
        if (pFVar7 != (Fl_Window *)0x0) {
          pFVar7 = Fl_Widget::window((Fl_Widget *)this);
          Fl_Widget::redraw((Fl_Widget *)pFVar7);
        }
        iVar6 = (*w->_vptr_Fl_Widget[0x21])();
        minh = gridy;
        iVar2 = gridx;
        if (iVar6 != 0) {
          iVar6 = Fl::w();
          maxh = Fl::h();
          Fl_Window::size_range(this,iVar2,minh,iVar6,maxh,gridx,gridy,0);
        }
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void x_cb(Fl_Value_Input *i, void *v) {
  if (v == LOAD) {
    x_input = i;
    if (current_widget->is_widget()) {
      i->value(((Fl_Widget_Type *)current_widget)->o->x());
      x_input->activate();
    } else x_input->deactivate();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        Fl_Widget *w = ((Fl_Widget_Type *)o)->o;
	w->resize((int)i->value(), w->y(), w->w(), w->h());
	if (w->window()) w->window()->redraw();
	if (o->is_window()) {
          ((Fl_Window *)w)->size_range(gridx, gridy, Fl::w(), Fl::h(),
                                       gridx, gridy, 0);
	}
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}